

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Stop_Freeze_PDU::Decode(Stop_Freeze_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    Simulation_Management_Header::Decode
              (&this->super_Simulation_Management_Header,stream,ignoreHeader);
    (*(this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_RealWorldTime,stream);
    KDataStream::Read(stream,&this->m_ui8Reason);
    KDataStream::Read(stream,&this->m_ui8FrozenBehaviour);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32RequestID);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Stop_Freeze_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < STOP_FREEZE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RealWorldTime
           >> m_ui8Reason
           >> m_ui8FrozenBehaviour
           >> m_ui16Padding
           >> m_ui32RequestID;
}